

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

char * docopt::value::kindAsString(Kind kind)

{
  if (kind < (StringList|Bool)) {
    return (&PTR_anon_var_dwarf_1e8353_001b9530)[kind];
  }
  return "unknown";
}

Assistant:

const char* value::kindAsString(Kind kind)
{
	switch (kind) {
		case Kind::Empty: return "empty";
		case Kind::Bool: return "bool";
		case Kind::Long: return "long";
		case Kind::String: return "string";
		case Kind::StringList: return "string-list";
	}
	return "unknown";
}